

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollectorOutput.cpp
# Opt level: O2

void __thiscall
Test::CollectorOutput::printException
          (CollectorOutput *this,string *suiteName,string *methodName,string *argString,
          exception *ex)

{
  char *__s;
  runtime_error *this_00;
  allocator<char> local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (this->currentMethod != (TestMethodInfo *)0x0) {
    this->currentMethod->withSuccess = false;
    __s = (char *)(**(code **)(*(long *)ex + 0x10))(ex);
    std::__cxx11::string::string((string *)&local_30,__s,&local_31);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->currentMethod->exceptionMessage,&local_30);
    std::__cxx11::string::~string(&local_30);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Invalid Test-Method!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void CollectorOutput::printException(const std::string &suiteName, const std::string &methodName,
    const std::string &argString, const std::exception &ex) {
  if (currentMethod == nullptr)
    throw std::runtime_error("Invalid Test-Method!");
  currentMethod->withSuccess = false;
  currentMethod->exceptionMessage = std::string(ex.what());
}